

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::function::function(function *this,object *o)

{
  handle h;
  bool bVar1;
  undefined1 auVar2 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  h.m_ptr = (this->super_object).super_handle.m_ptr;
  if (h.m_ptr != (PyObject *)0x0) {
    bVar1 = check_(h);
    if (!bVar1) {
      auVar2 = __cxa_allocate_exception(0x10);
      pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                (&local_48,(detail *)((this->super_object).super_handle.m_ptr)->ob_type,auVar2._8_8_
                );
      std::operator+(&local_68,"Object of type \'",&local_48);
      std::operator+(&local_88,&local_68,"\' is not an instance of \'function\'");
      type_error::runtime_error(auVar2._0_8_,&local_88);
      __cxa_throw(auVar2._0_8_,&type_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

handle cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        if (fun && PyCFunction_Check(fun.ptr()))
            return fun;
        return handle();
    }